

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winfnt.c
# Opt level: O0

FT_Error FNT_Size_Select(FT_Size size,FT_ULong strike_index)

{
  long lVar1;
  FT_WinFNT_Header header;
  FNT_Face face;
  FT_ULong strike_index_local;
  FT_Size size_local;
  
  lVar1 = size->face[1].num_faces;
  FT_Select_Metrics(size->face,0);
  (size->metrics).ascender = (long)(int)((uint)*(ushort *)(lVar1 + 0x5c) << 6);
  (size->metrics).descender =
       (long)(int)(((uint)*(ushort *)(lVar1 + 0x6c) - (uint)*(ushort *)(lVar1 + 0x5c)) * -0x40);
  (size->metrics).max_advance = (long)(int)((uint)*(ushort *)(lVar1 + 0x72) << 6);
  return 0;
}

Assistant:

static FT_Error
  FNT_Size_Select( FT_Size   size,
                   FT_ULong  strike_index )
  {
    FNT_Face          face   = (FNT_Face)size->face;
    FT_WinFNT_Header  header = &face->font->header;

    FT_UNUSED( strike_index );


    FT_Select_Metrics( size->face, 0 );

    size->metrics.ascender    = header->ascent * 64;
    size->metrics.descender   = -( header->pixel_height -
                                   header->ascent ) * 64;
    size->metrics.max_advance = header->max_width * 64;

    return FT_Err_Ok;
  }